

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testKNNValidatorNoDistanceFunction(void)

{
  bool bVar1;
  TypeUnion TVar2;
  UniformWeighting *this;
  NearestNeighborsIndex *this_00;
  LinearIndex *this_01;
  ostream *poVar3;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78);
  CoreML::KNNValidatorTests::generateInterface(&MStack_78);
  if (MStack_78._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 0x194;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar2.knearestneighborsclassifier_);
    MStack_78.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = MStack_78.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (MStack_78.Type_.knearestneighborsclassifier_,3,true);
  if (((TVar2.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (TVar2.knearestneighborsclassifier_);
    ((TVar2.supportvectorclassifier_)->rho_).total_size_ = 200;
    this = (UniformWeighting *)operator_new(0x18);
    CoreML::Specification::UniformWeighting::UniformWeighting(this);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(TVar2.pipeline_)->names_ + 1))->
    uniformweighting_ = this;
  }
  this_00 = (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this_00 == (NearestNeighborsIndex *)0x0) {
    this_00 = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(this_00);
    (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_ = this_00;
  }
  if (this_00->_oneof_case_[0] != 100) {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_00);
    this_00->_oneof_case_[0] = 100;
    this_01 = (LinearIndex *)operator_new(0x18);
    CoreML::Specification::LinearIndex::LinearIndex(this_01);
    (this_00->IndexType_).linearindex_ = this_01;
  }
  CoreML::KNNValidatorTests::addDataPoints(TVar2.knearestneighborsclassifier_);
  CoreML::KNNValidatorTests::addStringLabels(TVar2.knearestneighborsclassifier_);
  CoreML::validate<(MLModelType)404>(&local_48,&MStack_78);
  bVar1 = CoreML::Result::good(&local_48);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)bVar1;
}

Assistant:

int testKNNValidatorNoDistanceFunction() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_linearindex();

    KNNValidatorTests::addDataPoints(knnClassifier);
    KNNValidatorTests::addStringLabels(knnClassifier);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}